

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<OrderedScreen>::moveAppend
          (QGenericArrayOps<OrderedScreen> *this,OrderedScreen *b,OrderedScreen *e)

{
  qsizetype *pqVar1;
  QSizeF *pQVar2;
  drmModePropertyBlobPtr *pp_Var3;
  QKmsPlane **ppQVar4;
  OrderedScreen *pOVar5;
  long lVar6;
  undefined8 uVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  Data *pDVar11;
  _drmModeModeInfo *p_Var12;
  Data *pDVar13;
  QKmsPlane *pQVar14;
  qreal qVar15;
  qreal qVar16;
  undefined8 uVar17;
  drmModePropertyPtr p_Var18;
  drmModePropertyBlobPtr p_Var19;
  QSize QVar20;
  OrderedScreen *pOVar21;
  Representation RVar22;
  uint32_t uVar23;
  int iVar24;
  int iVar25;
  undefined4 uVar26;
  undefined3 uVar27;
  bool bVar28;
  uint32_t uVar29;
  
  if ((b != e) && (b < e)) {
    pOVar5 = (this->super_QArrayDataPointer<OrderedScreen>).ptr;
    do {
      lVar6 = (this->super_QArrayDataPointer<OrderedScreen>).size;
      pOVar5[lVar6].screen = b->screen;
      RVar22.m_i = (b->vinfo).virtualPos.xp.m_i;
      uVar7 = *(undefined8 *)((long)&(b->vinfo).virtualPos.xp.m_i + 1);
      pOVar5[lVar6].vinfo.virtualIndex = (b->vinfo).virtualIndex;
      pOVar5[lVar6].vinfo.virtualPos.xp = (Representation)RVar22.m_i;
      *(undefined8 *)((long)&pOVar5[lVar6].vinfo.virtualPos.xp.m_i + 1) = uVar7;
      pDVar8 = (b->vinfo).output.name.d.d;
      (b->vinfo).output.name.d.d = (Data *)0x0;
      pOVar5[lVar6].vinfo.output.name.d.d = pDVar8;
      pcVar9 = (b->vinfo).output.name.d.ptr;
      (b->vinfo).output.name.d.ptr = (char16_t *)0x0;
      pOVar5[lVar6].vinfo.output.name.d.ptr = pcVar9;
      qVar10 = (b->vinfo).output.name.d.size;
      (b->vinfo).output.name.d.size = 0;
      pOVar5[lVar6].vinfo.output.name.d.size = qVar10;
      uVar23 = (b->vinfo).output.crtc_index;
      uVar7 = *(undefined8 *)&(b->vinfo).output.crtc_id;
      qVar15 = (b->vinfo).output.physical_size.wd;
      qVar16 = (b->vinfo).output.physical_size.ht;
      iVar24 = (b->vinfo).output.preferred_mode;
      iVar25 = (b->vinfo).output.mode;
      uVar17 = *(undefined8 *)&(b->vinfo).output.mode_set;
      pOVar21 = pOVar5 + lVar6;
      (pOVar21->vinfo).output.connector_id = (b->vinfo).output.connector_id;
      (pOVar21->vinfo).output.crtc_index = uVar23;
      *(undefined8 *)(&(pOVar21->vinfo).output.connector_id + 2) = uVar7;
      pQVar2 = &pOVar5[lVar6].vinfo.output.physical_size;
      pQVar2->wd = qVar15;
      pQVar2->ht = qVar16;
      pOVar21 = pOVar5 + lVar6;
      (pOVar21->vinfo).output.preferred_mode = iVar24;
      (pOVar21->vinfo).output.mode = iVar25;
      *(undefined8 *)(&(pOVar21->vinfo).output.preferred_mode + 2) = uVar17;
      pOVar5[lVar6].vinfo.output.saved_crtc = (b->vinfo).output.saved_crtc;
      pDVar11 = (b->vinfo).output.modes.d.d;
      (b->vinfo).output.modes.d.d = (Data *)0x0;
      pOVar5[lVar6].vinfo.output.modes.d.d = pDVar11;
      p_Var12 = (b->vinfo).output.modes.d.ptr;
      (b->vinfo).output.modes.d.ptr = (_drmModeModeInfo *)0x0;
      pOVar5[lVar6].vinfo.output.modes.d.ptr = p_Var12;
      qVar10 = (b->vinfo).output.modes.d.size;
      (b->vinfo).output.modes.d.size = 0;
      pOVar5[lVar6].vinfo.output.modes.d.size = qVar10;
      uVar26 = *(undefined4 *)&(b->vinfo).output.field_0x6c;
      p_Var18 = (b->vinfo).output.dpms_prop;
      p_Var19 = (b->vinfo).output.edid_blob;
      uVar7 = *(undefined8 *)&(b->vinfo).output.wants_forced_plane;
      uVar27 = *(undefined3 *)&(b->vinfo).output.field_0x81;
      uVar23 = (b->vinfo).output.forced_plane_id;
      bVar28 = (b->vinfo).output.forced_plane_set;
      uVar17 = *(undefined8 *)&(b->vinfo).output.field_0x89;
      pOVar21 = pOVar5 + lVar6;
      (pOVar21->vinfo).output.subpixel = (b->vinfo).output.subpixel;
      *(undefined4 *)&(pOVar21->vinfo).output.field_0x6c = uVar26;
      *(drmModePropertyPtr *)(&(pOVar21->vinfo).output.subpixel + 2) = p_Var18;
      pp_Var3 = &pOVar5[lVar6].vinfo.output.edid_blob;
      *pp_Var3 = p_Var19;
      pp_Var3[1] = (drmModePropertyBlobPtr)uVar7;
      pOVar21 = pOVar5 + lVar6;
      *(undefined3 *)&(pOVar21->vinfo).output.field_0x81 = uVar27;
      (pOVar21->vinfo).output.forced_plane_id = uVar23;
      (pOVar21->vinfo).output.forced_plane_set = bVar28;
      *(undefined8 *)(&(pOVar21->vinfo).output.field_0x81 + 8) = uVar17;
      pDVar8 = (b->vinfo).output.clone_source.d.d;
      (b->vinfo).output.clone_source.d.d = (Data *)0x0;
      pOVar5[lVar6].vinfo.output.clone_source.d.d = pDVar8;
      pcVar9 = (b->vinfo).output.clone_source.d.ptr;
      (b->vinfo).output.clone_source.d.ptr = (char16_t *)0x0;
      pOVar5[lVar6].vinfo.output.clone_source.d.ptr = pcVar9;
      qVar10 = (b->vinfo).output.clone_source.d.size;
      (b->vinfo).output.clone_source.d.size = 0;
      pOVar5[lVar6].vinfo.output.clone_source.d.size = qVar10;
      pDVar13 = (b->vinfo).output.available_planes.d.d;
      (b->vinfo).output.available_planes.d.d = (Data *)0x0;
      pOVar5[lVar6].vinfo.output.available_planes.d.d = pDVar13;
      pQVar14 = (b->vinfo).output.available_planes.d.ptr;
      (b->vinfo).output.available_planes.d.ptr = (QKmsPlane *)0x0;
      pOVar5[lVar6].vinfo.output.available_planes.d.ptr = pQVar14;
      qVar10 = (b->vinfo).output.available_planes.d.size;
      (b->vinfo).output.available_planes.d.size = 0;
      pOVar5[lVar6].vinfo.output.available_planes.d.size = qVar10;
      QVar20 = (b->vinfo).output.size;
      uVar23 = (b->vinfo).output.crtcIdPropertyId;
      uVar29 = (b->vinfo).output.modeIdPropertyId;
      uVar7 = *(undefined8 *)&(b->vinfo).output.activePropertyId;
      ppQVar4 = &pOVar5[lVar6].vinfo.output.eglfs_plane;
      *ppQVar4 = (b->vinfo).output.eglfs_plane;
      *(QSize *)(ppQVar4 + 1) = QVar20;
      pOVar21 = pOVar5 + lVar6;
      (pOVar21->vinfo).output.crtcIdPropertyId = uVar23;
      (pOVar21->vinfo).output.modeIdPropertyId = uVar29;
      *(undefined8 *)(&(pOVar21->vinfo).output.crtcIdPropertyId + 2) = uVar7;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<OrderedScreen>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }